

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_oc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  TCGv_i64 local_30;
  
  if (((s->fields).presentO & 0x8000) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    pTVar1 = tcg_const_i32_s390x(tcg_ctx,(s->fields).c[3]);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_38 = o->addr1 + (long)tcg_ctx;
    local_30 = o->in2 + (long)tcg_ctx;
    local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_oc,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_48);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    set_cc_static(s);
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_oc(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 l = tcg_const_i32(tcg_ctx, get_field(s, l1));
    gen_helper_oc(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, l, o->addr1, o->in2);
    tcg_temp_free_i32(tcg_ctx, l);
    set_cc_static(s);
    return DISAS_NEXT;
}